

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Aig_Obj_t * Saig_BmcObjFrame(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i)

{
  uint uVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar2;
  
  p_00 = (Vec_Int_t *)Vec_PtrEntry(p->vAig2Frm,i);
  uVar1 = Vec_IntEntry(p_00,pObj->Id);
  if (uVar1 != 0xffffffff) {
    if ((int)uVar1 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf2,"int Abc_Lit2Var(int)");
    }
    pAVar2 = Aig_ManObj(p->pFrm,uVar1 >> 1);
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      return (Aig_Obj_t *)((ulong)pAVar2 ^ (ulong)(uVar1 & 1));
    }
    Vec_IntWriteEntry(p_00,pObj->Id,-1);
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

static inline Aig_Obj_t * Saig_BmcObjFrame( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i )                       
{ 
//    return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     
    Aig_Obj_t * pRes;
    Vec_Int_t * vFrame = (Vec_Int_t *)Vec_PtrEntry( p->vAig2Frm, i );
    int iObjLit = Vec_IntEntry( vFrame, Aig_ObjId(pObj) );
    if ( iObjLit == -1 )
        return NULL;
    pRes = Aig_ManObj( p->pFrm, Abc_Lit2Var(iObjLit) );
    if ( pRes == NULL )
        Vec_IntWriteEntry( vFrame, Aig_ObjId(pObj), -1 );
    else
        pRes = Aig_NotCond( pRes, Abc_LitIsCompl(iObjLit) );
    return pRes;
}